

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  bool bVar1;
  cmake *pcVar2;
  char *pcVar3;
  cmGeneratedFileStream *this_00;
  ostream *poVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  string sourceFileName;
  allocator local_b9;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string buildFilePath;
  allocator local_41;
  undefined1 local_40 [8];
  string buildFileDir;
  string *sourceFile_local;
  string *commandLine_local;
  cmGlobalNinjaGenerator *this_local;
  
  buildFileDir.field_2._8_8_ = sourceFile;
  pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  pcVar3 = cmake::GetHomeOutputDirectory(pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar3,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (this->CompileCommandsStream == (cmGeneratedFileStream *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "/compile_commands.json");
    if ((this->ComputingUnknownDependencies & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,"compile_commands.json",&local_b9);
      NinjaOutputPath(&local_98,this,&local_b8);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->CombinedBuildOutputs,&local_98);
      sourceFileName.field_2._8_8_ = pVar5.first._M_node;
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,pcVar3,false,None);
    this->CompileCommandsStream = this_00;
    std::operator<<((ostream *)this->CompileCommandsStream,"[");
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,",");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string((string *)local_f0,(string *)buildFileDir.field_2._8_8_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
  if (!bVar1) {
    pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    pcVar3 = cmake::GetHomeOutputDirectory(pcVar2);
    cmsys::SystemTools::CollapseFullPath(&local_110,(string *)local_f0,pcVar3);
    std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  poVar4 = std::operator<<((ostream *)this->CompileCommandsStream,"\n{\n");
  poVar4 = std::operator<<(poVar4,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_130,(string *)local_40);
  poVar4 = std::operator<<(poVar4,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_150,commandLine);
  poVar4 = std::operator<<(poVar4,(string *)&local_150);
  poVar4 = std::operator<<(poVar4,"\",\n");
  poVar4 = std::operator<<(poVar4,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_170,(string *)local_f0);
  poVar4 = std::operator<<(poVar4,(string *)&local_170);
  poVar4 = std::operator<<(poVar4,"\"\n");
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      new cmGeneratedFileStream(buildFilePath.c_str());
    *this->CompileCommandsStream << "[";
  } else {
    *this->CompileCommandsStream << "," << std::endl;
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str())) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "\n{\n"
     << "  \"directory\": \""
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << "  \"command\": \""
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << "  \"file\": \""
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
  /* clang-format on */
}